

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall
amrex::AmrMesh::InitAmrMesh
          (AmrMesh *this,int max_level_in,Vector<int,_std::allocator<int>_> *n_cell_in,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *a_refrat,RealBox *rb,int coord,
          int *is_per)

{
  value_type vVar1;
  uint uVar2;
  undefined8 uVar3;
  IntVect *pIVar4;
  int *piVar5;
  Long LVar6;
  IntVect *pIVar7;
  reference pvVar8;
  int iVar9;
  int in_ESI;
  int iVar10;
  long in_RDI;
  bool bVar11;
  AmrMesh *in_stack_000000f0;
  int i_27;
  Box index_domain;
  IntVect hi;
  IntVect lo;
  int i_26;
  Vector<int,_std::allocator<int>_> n_cell;
  int i_25;
  int i_24;
  int n_12;
  Vector<int,_std::allocator<int>_> bf_3;
  int idim_8;
  int i_23;
  int i_22;
  int n_11;
  Vector<int,_std::allocator<int>_> bf_2;
  int idim_7;
  int i_21;
  int i_20;
  int n_10;
  Vector<int,_std::allocator<int>_> bf_1;
  int idim_6;
  int last_bf;
  Vector<int,_std::allocator<int>_> bf;
  int i_19;
  int i_18;
  int n_9;
  Vector<int,_std::allocator<int>_> mgs_3;
  int idim_5;
  int i_17;
  int i_16;
  int n_8;
  Vector<int,_std::allocator<int>_> mgs_2;
  int idim_4;
  int i_15;
  int i_14;
  int n_7;
  Vector<int,_std::allocator<int>_> mgs_1;
  int idim_3;
  int last_mgs;
  Vector<int,_std::allocator<int>_> mgs;
  int i_13;
  int n_6;
  int i_12;
  int n_5;
  int i_11;
  int ncnt;
  int n_4;
  int i_10;
  int k;
  int got_int;
  Vector<int,_std::allocator<int>_> ratios;
  int got_vect;
  Vector<int,_std::allocator<int>_> ratios_vect;
  int nratios_vect;
  int i_9;
  int i_8;
  int n_3;
  Vector<int,_std::allocator<int>_> neb_3;
  int idim_2;
  int i_7;
  int i_6;
  int n_2;
  Vector<int,_std::allocator<int>_> neb_2;
  int idim_1;
  int i_5;
  int i_4;
  int n_1;
  Vector<int,_std::allocator<int>_> neb_1;
  int idim;
  int i_3;
  int i_2;
  int n;
  Vector<int,_std::allocator<int>_> neb;
  int cnt;
  int i_1;
  int i;
  int nlev;
  ParmParse pp;
  IntVect shft;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff3f8;
  undefined7 in_stack_fffffffffffff400;
  undefined1 in_stack_fffffffffffff407;
  string *in_stack_fffffffffffff408;
  string *psVar12;
  ParmParse *in_stack_fffffffffffff410;
  undefined4 in_stack_fffffffffffff418;
  int in_stack_fffffffffffff41c;
  AmrMesh *in_stack_fffffffffffff420;
  RealBox *rb_00;
  int in_stack_fffffffffffff428;
  int in_stack_fffffffffffff42c;
  Print *in_stack_fffffffffffff430;
  int in_stack_fffffffffffff468;
  int in_stack_fffffffffffff46c;
  Print *in_stack_fffffffffffff470;
  char *in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  char *in_stack_fffffffffffff488;
  ParmParse *in_stack_fffffffffffff490;
  int iVar13;
  undefined4 in_stack_fffffffffffff498;
  undefined4 in_stack_fffffffffffff49c;
  int in_stack_fffffffffffff4a0;
  int in_stack_fffffffffffff4a4;
  IntVect local_a14;
  int local_a08;
  string local_a04;
  int iStack_9e4;
  int local_9e0;
  int local_9d8;
  int iStack_9d4;
  int local_9d0;
  int local_9cc;
  int local_9c8;
  int local_9c4;
  int local_9c0 [2];
  int local_9b8;
  int local_9b0 [2];
  int local_9a8;
  int local_9a0;
  RealBox local_999;
  int local_954;
  int local_950;
  int local_94c;
  int local_948;
  int local_944;
  int local_924;
  int local_920;
  int local_91c;
  int local_918;
  int local_914;
  char local_910 [24];
  int local_8f8;
  value_type local_8f4;
  ParmParse local_8f0;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_850;
  value_type local_84c;
  int local_82c;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int local_660;
  int local_63c;
  int local_638;
  int local_634;
  int local_630;
  int local_62c;
  int local_60c;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5ac;
  IntVect local_5a8;
  int local_59c;
  IntVect local_598;
  int local_58c;
  int local_588;
  int local_584;
  int local_564;
  int local_560 [2];
  int local_558;
  int local_550 [2];
  int local_548;
  int local_540;
  int iStack_53c;
  int local_538;
  int local_530 [2];
  int local_528;
  int local_524;
  IntVect local_520;
  IntVect local_514;
  IntVect local_508;
  int local_4fc;
  int local_4f8;
  allocator local_4e1;
  string local_4e0 [156];
  int local_444;
  int local_438 [2];
  int local_430;
  int *local_428;
  undefined4 local_420;
  IntVect local_41c;
  int local_410 [2];
  int local_408;
  IntVect local_3fc;
  int local_3f0 [2];
  int local_3e8;
  IntVect local_3e0;
  undefined4 local_3d4;
  long local_3d0;
  undefined4 local_3c4;
  long local_3c0;
  undefined4 local_3b4;
  long local_3b0;
  int local_3a4;
  IntVect *local_3a0;
  int local_394;
  IntVect *local_390;
  int local_384;
  IntVect *local_380;
  int local_374;
  IntVect *local_370;
  int local_364;
  IntVect *local_360;
  int local_354;
  IntVect *local_350;
  int local_344;
  IntVect *local_340;
  int local_334;
  IntVect *local_330;
  int local_324;
  IntVect *local_320;
  int local_314;
  IntVect *local_310;
  int local_304;
  IntVect *local_300;
  int local_2f4;
  IntVect *local_2f0;
  int local_2e4;
  IntVect *local_2e0;
  int local_2d4;
  IntVect *local_2d0;
  int local_2c4;
  IntVect *local_2c0;
  int local_2b4;
  IntVect *local_2b0;
  int local_2a4;
  IntVect *local_2a0;
  int local_294;
  IntVect *local_290;
  int local_284;
  IntVect *local_280;
  int local_274;
  IntVect *local_270;
  int local_264;
  IntVect *local_260;
  char *local_258;
  int local_250 [2];
  int local_248;
  IntVect local_23c;
  int *local_230;
  int *local_228;
  int local_220 [2];
  int local_218;
  int local_210;
  int iStack_20c;
  int local_208;
  IntVect local_204;
  ParmParse *local_1f8;
  string *local_1f0;
  IntVect *local_1e8;
  int *local_1e0;
  int *local_1d8;
  IntVect *local_1d0;
  undefined4 local_1c4;
  ParmParse *local_1c0;
  undefined4 local_1b4;
  int *local_1b0;
  undefined4 local_1a4;
  IntVect *local_1a0;
  undefined4 local_194;
  IntVect *local_190;
  undefined4 local_184;
  IntVect *local_180;
  undefined4 local_174;
  int *local_170;
  undefined4 local_164;
  int *local_160;
  undefined4 local_154;
  int *local_150;
  undefined4 local_144;
  int *local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  int *local_120;
  undefined4 local_114;
  int *local_110;
  undefined4 local_104;
  int *local_100;
  undefined4 local_f4;
  int *local_f0;
  int local_e8 [2];
  int local_e0;
  uint *local_d8;
  IntVect local_cc;
  ParmParse *local_c0;
  int *local_b8;
  undefined4 local_ac;
  ParmParse *local_a8;
  undefined4 local_9c;
  ParmParse *local_98;
  undefined4 local_8c;
  ParmParse *local_88;
  ParmParse *local_80;
  string *local_78;
  undefined4 local_6c;
  ParmParse *local_68;
  undefined4 local_5c;
  ParmParse *local_58;
  undefined4 local_4c;
  ParmParse *local_48;
  IntVect *local_40;
  int *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_444 = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"amr",&local_4e1);
  ParmParse::ParmParse(in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  ParmParse::queryAdd<int,_0>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (int *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
  if (local_444 == -1) {
    ParmParse::get((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                   in_stack_fffffffffffff478,&in_stack_fffffffffffff470->rank,
                   in_stack_fffffffffffff46c);
  }
  else {
    *(int *)(in_RDI + 0xc) = local_444;
  }
  local_4f8 = *(int *)(in_RDI + 0xc) + 1;
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
             CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418));
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
             CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418));
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
             CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418));
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::resize
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_stack_fffffffffffff420,
             CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418));
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::resize
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             in_stack_fffffffffffff420,CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418)
            );
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff420,
             CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418));
  for (local_4fc = 0; local_4fc < local_4f8; local_4fc = local_4fc + 1) {
    IntVect::IntVect(&local_508,1,1,1);
    pIVar4 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                        (size_type)in_stack_fffffffffffff3f8);
    *(undefined8 *)pIVar4->vect = local_508.vect._0_8_;
    pIVar4->vect[2] = local_508.vect[2];
    IntVect::IntVect(&local_514,8,8,8);
    pIVar4 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                        (size_type)in_stack_fffffffffffff3f8);
    *(undefined8 *)pIVar4->vect = local_514.vect._0_8_;
    pIVar4->vect[2] = local_514.vect[2];
    IntVect::IntVect(&local_520,0x20,0x20,0x20);
    pIVar4 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                        (size_type)in_stack_fffffffffffff3f8);
    *(undefined8 *)pIVar4->vect = local_520.vect._0_8_;
    pIVar4->vect[2] = local_520.vect[2];
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
             CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418));
  for (local_524 = 0; local_524 < *(int *)(in_RDI + 0xc); local_524 = local_524 + 1) {
    IntVect::IntVect(&local_3e0,1);
    local_3e8 = local_3e0.vect[2];
    local_3f0[0] = local_3e0.vect[0];
    local_3f0[1] = local_3e0.vect[1];
    local_548 = local_3e0.vect[2];
    local_550[0] = local_3e0.vect[0];
    local_550[1] = local_3e0.vect[1];
    local_538 = local_3e0.vect[2];
    local_540 = local_3e0.vect[0];
    iStack_53c = local_3e0.vect[1];
    uVar3 = _local_540;
    local_420 = 2;
    local_428 = &local_540;
    local_f4 = 0;
    local_540 = local_3e0.vect[0];
    iVar10 = local_540 * 2;
    local_104 = 1;
    iStack_53c = local_3e0.vect[1];
    iVar9 = iStack_53c * 2;
    local_114 = 2;
    _local_540 = uVar3;
    local_110 = local_428;
    local_100 = local_428;
    local_f0 = local_428;
    IntVect::IntVect(&local_41c,iVar10,iVar9,local_3e0.vect[2] * 2);
    local_430 = local_41c.vect[2];
    local_438[0] = local_41c.vect[0];
    local_438[1] = local_41c.vect[1];
    local_558 = local_41c.vect[2];
    local_560[0] = local_41c.vect[0];
    local_560[1] = local_41c.vect[1];
    local_530[0] = local_41c.vect[0];
    local_530[1] = local_41c.vect[1];
    local_528 = local_41c.vect[2];
    pIVar4 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                        (size_type)in_stack_fffffffffffff3f8);
    *(int (*) [2])pIVar4->vect = local_530;
    pIVar4->vect[2] = local_528;
  }
  ParmParse::queryAdd<int,_0>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (int *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
  ParmParse::queryAdd<double,_0>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (double *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                   in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  if (0 < local_564) {
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d11ea);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_588 = *(int *)(in_RDI + 0xc) + 1;
    piVar5 = std::min<int>(&local_564,&local_588);
    local_584 = *piVar5;
    for (local_58c = 0; local_58c < local_584; local_58c = local_58c + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      IntVect::IntVect(&local_598,*piVar5);
      pIVar4 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      *(undefined8 *)pIVar4->vect = local_598.vect._0_8_;
      pIVar4->vect[2] = local_598.vect[2];
    }
    for (local_59c = local_584; local_59c <= *(int *)(in_RDI + 0xc); local_59c = local_59c + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      IntVect::IntVect(&local_5a8,*piVar5);
      pIVar4 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      *(undefined8 *)pIVar4->vect = local_5a8.vect._0_8_;
      pIVar4->vect[2] = local_5a8.vect[2];
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d13a2);
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                   in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  if (0 < local_564) {
    local_5ac = 0;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d1400);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_5d0 = *(int *)(in_RDI + 0xc) + 1;
    piVar5 = std::min<int>(&local_564,&local_5d0);
    local_5cc = *piVar5;
    for (local_5d4 = 0; local_5d4 < local_5cc; local_5d4 = local_5d4 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_260 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_264 = local_5ac;
      local_260->vect[local_5ac] = iVar9;
    }
    for (local_5d8 = local_5cc; local_5d8 <= *(int *)(in_RDI + 0xc); local_5d8 = local_5d8 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_270 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_274 = local_5ac;
      local_270->vect[local_5ac] = iVar9;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d15ef);
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                   in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  if (0 < local_564) {
    local_5dc = 1;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d164d);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_600 = *(int *)(in_RDI + 0xc) + 1;
    piVar5 = std::min<int>(&local_564,&local_600);
    local_5fc = *piVar5;
    for (local_604 = 0; local_604 < local_5fc; local_604 = local_604 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_280 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_284 = local_5dc;
      local_280->vect[local_5dc] = iVar9;
    }
    for (local_608 = local_5fc; local_608 <= *(int *)(in_RDI + 0xc); local_608 = local_608 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_290 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_294 = local_5dc;
      local_290->vect[local_5dc] = iVar9;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d183c);
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                   in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  if (0 < local_564) {
    local_60c = 2;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d189a);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_630 = *(int *)(in_RDI + 0xc) + 1;
    piVar5 = std::min<int>(&local_564,&local_630);
    local_62c = *piVar5;
    for (local_634 = 0; local_634 < local_62c; local_634 = local_634 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_2a0 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_2a4 = local_60c;
      local_2a0->vect[local_60c] = iVar9;
    }
    for (local_638 = local_62c; local_638 <= *(int *)(in_RDI + 0xc); local_638 = local_638 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_2b0 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_2b4 = local_60c;
      local_2b0->vect[local_60c] = iVar9;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d1a89);
  }
  if (0 < *(int *)(in_RDI + 0xc)) {
    local_63c = *(int *)(in_RDI + 0xc) * 3;
    std::allocator<int>::allocator((allocator<int> *)0x10d1ad7);
    Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
               (size_type)in_stack_fffffffffffff3f8,(allocator_type *)0x10d1af4);
    std::allocator<int>::~allocator((allocator<int> *)0x10d1b03);
    local_660 = ParmParse::queryarr(in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                                    (vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                                    (int)((ulong)in_stack_fffffffffffff478 >> 0x20),
                                    (int)in_stack_fffffffffffff478);
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d1b55);
    local_67c = ParmParse::queryarr(in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                                    (vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                                    (int)((ulong)in_stack_fffffffffffff478 >> 0x20),
                                    (int)in_stack_fffffffffffff478);
    if ((local_67c == 1) && (local_660 == 1)) {
      local_258 = "Only input *either* ref_ratio or ref_ratio_vect";
      Abort_host((char *)in_stack_fffffffffffff410);
    }
    else if (local_660 == 1) {
      local_680 = 0;
      for (local_684 = 0; local_684 < *(int *)(in_RDI + 0xc); local_684 = local_684 + 1) {
        for (local_688 = 0; local_688 < 3; local_688 = local_688 + 1) {
          piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)
                              CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                              (size_type)in_stack_fffffffffffff3f8);
          iVar9 = *piVar5;
          local_2c0 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                                 (size_type)in_stack_fffffffffffff3f8);
          local_2c4 = local_688;
          local_2c0->vect[local_688] = iVar9;
          local_680 = local_680 + 1;
        }
      }
    }
    else if (local_67c == 1) {
      LVar6 = Vector<int,_std::allocator<int>_>::size
                        ((Vector<int,_std::allocator<int>_> *)0x10d1d47);
      local_68c = (int)LVar6;
      local_690 = 0;
      while( true ) {
        bVar11 = false;
        if (local_690 < local_68c) {
          bVar11 = local_690 < *(int *)(in_RDI + 0xc);
        }
        if (!bVar11) break;
        for (local_694 = 0; local_694 < 3; local_694 = local_694 + 1) {
          piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)
                              CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                              (size_type)in_stack_fffffffffffff3f8);
          iVar9 = *piVar5;
          local_2d0 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                                 (size_type)in_stack_fffffffffffff3f8);
          local_2d4 = local_694;
          local_2d0->vect[local_694] = iVar9;
        }
        local_690 = local_690 + 1;
      }
      for (local_698 = local_68c; local_698 < *(int *)(in_RDI + 0xc); local_698 = local_698 + 1) {
        for (local_69c = 0; local_69c < 3; local_69c = local_69c + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::back
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
          vVar1 = *pvVar8;
          local_2e0 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                                 (size_type)in_stack_fffffffffffff3f8);
          local_2e4 = local_69c;
          local_2e0->vect[local_69c] = vVar1;
        }
      }
    }
    else if (*(int *)(in_RDI + 8) != 0) {
      OutStream();
      Print::Print(in_stack_fffffffffffff430,
                   (ostream *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      Print::operator<<((Print *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                        (char (*) [43])in_stack_fffffffffffff3f8);
      Print::~Print(in_stack_fffffffffffff470);
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d1fb3);
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d1fc0);
  }
  LVar6 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::size
                    ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x10d1fee);
  if (0 < LVar6) {
    for (local_82c = 0; local_82c < *(int *)(in_RDI + 0xc); local_82c = local_82c + 1) {
      pIVar4 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      pIVar7 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      *(undefined8 *)pIVar7->vect = *(undefined8 *)pIVar4->vect;
      pIVar7->vect[2] = pIVar4->vect[2];
    }
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                   in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  if (0 < local_564) {
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d20cd);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    pvVar8 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)
                        CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
    local_84c = *pvVar8;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff430,
               CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
               (value_type *)in_stack_fffffffffffff420);
    SetMaxGridSize(in_stack_fffffffffffff420,
                   (Vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418));
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d215d);
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                   in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  if (0 < local_564) {
    local_850 = 0;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d21e3);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_870 = *(int *)(in_RDI + 0xc) + 1;
    piVar5 = std::min<int>(&local_564,&local_870);
    local_86c = *piVar5;
    for (local_874 = 0; local_874 < local_86c; local_874 = local_874 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_2f0 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_2f4 = local_850;
      local_2f0->vect[local_850] = iVar9;
    }
    for (local_878 = local_86c; local_878 <= *(int *)(in_RDI + 0xc); local_878 = local_878 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_300 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_304 = local_850;
      local_300->vect[local_850] = iVar9;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d23d2);
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                   in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  if (0 < local_564) {
    local_87c = 1;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d2430);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_8f0.m_table._0_4_ = *(int *)(in_RDI + 0xc) + 1;
    piVar5 = std::min<int>(&local_564,(int *)&local_8f0.m_table);
    local_8f0.m_table._4_4_ = *piVar5;
    for (local_8f0.m_pstack.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ = 0;
        local_8f0.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ < local_8f0.m_table._4_4_;
        local_8f0.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ =
             local_8f0.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_310 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_314 = local_87c;
      local_310->vect[local_87c] = iVar9;
    }
    for (local_8f0.m_pstack.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = local_8f0.m_table._4_4_;
        (int)local_8f0.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node <= *(int *)(in_RDI + 0xc);
        local_8f0.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ =
             (int)local_8f0.m_pstack.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar9 = *piVar5;
      local_320 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_324 = local_87c;
      local_320->vect[local_87c] = iVar9;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d261f);
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(in_stack_fffffffffffff49c,
                                                   in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  if (0 < local_564) {
    local_8f0.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_ = 2;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d267d);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_8f0.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last._0_4_ = *(int *)(in_RDI + 0xc) + 1;
    piVar5 = std::min<int>(&local_564,
                           (int *)&local_8f0.m_pstack.c.
                                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_last);
    local_8f0.m_pstack.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ = *piVar5;
    for (local_8f0.m_pstack.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ = 0;
        local_8f0.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ <
        local_8f0.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_;
        local_8f0.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ =
             local_8f0.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      in_stack_fffffffffffff4a4 = *piVar5;
      local_330 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_334 = local_8f0.m_pstack.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
      local_330->vect
      [local_8f0.m_pstack.c.
       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_] = in_stack_fffffffffffff4a4;
    }
    for (local_8f0.m_pstack.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ =
              local_8f0.m_pstack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_;
        (int)local_8f0.m_pstack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first <= *(int *)(in_RDI + 0xc);
        local_8f0.m_pstack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ =
             (int)local_8f0.m_pstack.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      in_stack_fffffffffffff4a0 = *piVar5;
      local_340 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_344 = local_8f0.m_pstack.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
      local_340->vect
      [local_8f0.m_pstack.c.
       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_] = in_stack_fffffffffffff4a0;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d286c);
  }
  iVar9 = ParmParse::countval((ParmParse *)
                              CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                              (char *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                              (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  local_564 = iVar9;
  if (0 < iVar9) {
    in_stack_fffffffffffff490 = &local_8f0;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d28bf);
    ParmParse::getarr((ParmParse *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    pvVar8 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)
                        CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
    local_8f4 = *pvVar8;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff430,
               CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
               (value_type *)in_stack_fffffffffffff420);
    SetBlockingFactor(in_stack_fffffffffffff420,
                      (Vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418));
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d294f);
  }
  iVar10 = ParmParse::countval((ParmParse *)
                               CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                               (char *)CONCAT44(iVar9,in_stack_fffffffffffff498),
                               (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  local_564 = iVar10;
  if (0 < iVar10) {
    local_8f8 = 0;
    in_stack_fffffffffffff478 = local_910;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d29d5);
    ParmParse::getarr((ParmParse *)CONCAT44(iVar10,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_918 = *(int *)(in_RDI + 0xc) + 1;
    in_stack_fffffffffffff470 = (Print *)std::min<int>(&local_564,&local_918);
    local_914 = *(int *)&(((_Vector_base<int,_std::allocator<int>_> *)
                          &in_stack_fffffffffffff470->rank)->_M_impl).super__Vector_impl_data.
                         _M_start;
    for (local_91c = 0; local_91c < local_914; local_91c = local_91c + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      in_stack_fffffffffffff46c = *piVar5;
      local_350 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_354 = local_8f8;
      local_350->vect[local_8f8] = in_stack_fffffffffffff46c;
    }
    for (local_920 = local_914; local_920 <= *(int *)(in_RDI + 0xc); local_920 = local_920 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      in_stack_fffffffffffff468 = *piVar5;
      local_360 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_364 = local_8f8;
      local_360->vect[local_8f8] = in_stack_fffffffffffff468;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d2bb2);
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(iVar9,in_stack_fffffffffffff498),
                                  (int)((ulong)in_stack_fffffffffffff490 >> 0x20));
  iVar13 = (int)((ulong)in_stack_fffffffffffff490 >> 0x20);
  if (0 < local_564) {
    local_924 = 1;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d2c07);
    ParmParse::getarr((ParmParse *)CONCAT44(iVar10,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_948 = *(int *)(in_RDI + 0xc) + 1;
    piVar5 = std::min<int>(&local_564,&local_948);
    local_944 = *piVar5;
    for (local_94c = 0; local_94c < local_944; local_94c = local_94c + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar13 = *piVar5;
      local_370 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_374 = local_924;
      local_370->vect[local_924] = iVar13;
    }
    for (local_950 = local_944; iVar13 = (int)((ulong)in_stack_fffffffffffff490 >> 0x20),
        local_950 <= *(int *)(in_RDI + 0xc); local_950 = local_950 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      iVar13 = *piVar5;
      local_380 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_384 = local_924;
      local_380->vect[local_924] = iVar13;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d2de1);
  }
  local_564 = ParmParse::countval((ParmParse *)
                                  CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                                  (char *)CONCAT44(iVar9,in_stack_fffffffffffff498),iVar13);
  if (0 < local_564) {
    local_954 = 2;
    Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x10d2e36);
    ParmParse::getarr((ParmParse *)CONCAT44(iVar10,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
    local_999.xhi[1]._1_4_ = *(int *)(in_RDI + 0xc) + 1;
    in_stack_fffffffffffff430 = (Print *)std::min<int>(&local_564,(int *)((long)local_999.xhi + 9));
    local_999.xhi._13_4_ = in_stack_fffffffffffff430->rank;
    for (local_999.xhi._5_4_ = 0; (int)local_999.xhi._5_4_ < (int)local_999.xhi._13_4_;
        local_999.xhi._5_4_ = local_999.xhi._5_4_ + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      in_stack_fffffffffffff42c = *piVar5;
      local_390 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_394 = local_954;
      local_390->vect[local_954] = in_stack_fffffffffffff42c;
    }
    for (local_999.xhi[0]._1_4_ = local_999.xhi._13_4_;
        local_999.xhi[0]._1_4_ <= *(int *)(in_RDI + 0xc);
        local_999.xhi[0]._1_4_ = local_999.xhi[0]._1_4_ + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      in_stack_fffffffffffff428 = *piVar5;
      local_3a0 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                             (size_type)in_stack_fffffffffffff3f8);
      local_3a4 = local_954;
      local_3a0->vect[local_954] = in_stack_fffffffffffff428;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d3010);
  }
  rb_00 = &local_999;
  std::allocator<int>::allocator((allocator<int> *)0x10d3022);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
             (size_type)in_stack_fffffffffffff3f8,(allocator_type *)0x10d3039);
  std::allocator<int>::~allocator((allocator<int> *)0x10d3048);
  piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)
                      CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                      (size_type)in_stack_fffffffffffff3f8);
  if (*piVar5 == -1) {
    ParmParse::getarr((ParmParse *)CONCAT44(iVar10,in_stack_fffffffffffff480),
                      in_stack_fffffffffffff478,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff470,
                      in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
  }
  else {
    for (local_9a0 = 0; local_9a0 < 3; local_9a0 = local_9a0 + 1) {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      in_stack_fffffffffffff41c = *piVar5;
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                          (size_type)in_stack_fffffffffffff3f8);
      *piVar5 = in_stack_fffffffffffff41c;
    }
  }
  IntVect::IntVect(&local_23c,0);
  local_248 = local_23c.vect[2];
  local_250[0] = local_23c.vect[0];
  local_250[1] = local_23c.vect[1];
  local_9b8 = local_23c.vect[2];
  local_9c0[0] = local_23c.vect[0];
  local_9c0[1] = local_23c.vect[1];
  local_9a8 = local_23c.vect[2];
  local_9b0[0] = local_23c.vect[0];
  local_9b0[1] = local_23c.vect[1];
  IntVect::IntVect((IntVect *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                   in_stack_fffffffffffff3f8);
  IntVect::IntVect(&local_3fc,1);
  local_408 = local_3fc.vect[2];
  local_410[0] = local_3fc.vect[0];
  local_410[1] = local_3fc.vect[1];
  local_9e0 = local_3fc.vect[2];
  local_a04.field_2._12_4_ = local_3fc.vect[0];
  iStack_9e4 = local_3fc.vect[1];
  local_9d8 = local_3fc.vect[0];
  iStack_9d4 = local_3fc.vect[1];
  uVar3 = _local_9d8;
  local_9d0 = local_3fc.vect[2];
  local_228 = &local_9cc;
  local_230 = &local_9d8;
  local_124 = 0;
  local_9d8 = local_3fc.vect[0];
  local_9cc = local_9cc - local_9d8;
  local_134 = 1;
  iStack_9d4 = local_3fc.vect[1];
  local_9c8 = local_9c8 - iStack_9d4;
  local_144 = 2;
  local_9c4 = local_9c4 - local_3fc.vect[2];
  _local_9d8 = uVar3;
  local_140 = local_230;
  local_130 = local_230;
  local_120 = local_230;
  Box::Box((Box *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
           (IntVect *)in_stack_fffffffffffff3f8,(IntVect *)0x10d3304);
  for (local_a08 = 0; local_a08 <= *(int *)(in_RDI + 0xc); local_a08 = local_a08 + 1) {
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
               (size_type)in_stack_fffffffffffff3f8);
    Geometry::define((Geometry *)in_stack_fffffffffffff430,
                     (Box *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),rb_00,
                     in_stack_fffffffffffff41c,(int *)in_stack_fffffffffffff410);
    if (local_a08 < *(int *)(in_RDI + 0xc)) {
      in_stack_fffffffffffff410 =
           (ParmParse *)
           Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                     ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                      CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                      (size_type)in_stack_fffffffffffff3f8);
      in_stack_fffffffffffff408 = &local_a04;
      local_1c4 = 1;
      bVar11 = true;
      if ((*(int *)&(in_stack_fffffffffffff410->m_pstack).c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map == 1) &&
         (bVar11 = true,
         *(int *)((long)&(in_stack_fffffffffffff410->m_pstack).c.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_map + 4) == 1)) {
        bVar11 = (int)(in_stack_fffffffffffff410->m_pstack).c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map_size != 1;
      }
      local_1f8 = in_stack_fffffffffffff410;
      local_1f0 = in_stack_fffffffffffff408;
      local_1c0 = in_stack_fffffffffffff410;
      if (bVar11) {
        IntVect::IntVect(&local_204,1);
        local_d8 = (uint *)((long)&in_stack_fffffffffffff408->field_2 + 8);
        uVar2 = *local_d8;
        IntVect::IntVect(&local_cc,uVar2 & 1,uVar2 >> 1 & 1,uVar2 >> 2 & 1);
        local_e0 = local_cc.vect[2];
        local_e8[0] = local_cc.vect[0];
        local_e8[1] = local_cc.vect[1];
        local_218 = local_cc.vect[2];
        local_220[0] = local_cc.vect[0];
        local_220[1] = local_cc.vect[1];
        local_210 = local_cc.vect[0];
        iStack_20c = local_cc.vect[1];
        uVar3 = _local_210;
        local_208 = local_cc.vect[2];
        local_1d0 = &local_204;
        local_1d8 = &local_210;
        local_154 = 0;
        local_210 = local_cc.vect[0];
        local_204.vect[0] = local_204.vect[0] - local_210;
        local_164 = 1;
        iStack_20c = local_cc.vect[1];
        local_204.vect[1] = local_204.vect[1] - iStack_20c;
        local_174 = 2;
        local_204.vect[2] = local_204.vect[2] - local_cc.vect[2];
        local_80 = local_1f8;
        local_48 = local_1f8;
        local_4c = 0;
        psVar12 = in_stack_fffffffffffff408;
        _local_210 = uVar3;
        local_170 = local_1d8;
        local_160 = local_1d8;
        local_150 = local_1d8;
        local_78 = in_stack_fffffffffffff408;
        *(int *)in_stack_fffffffffffff408 =
             *(int *)&(local_1f8->m_pstack).c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map * *(int *)in_stack_fffffffffffff408;
        local_58 = local_80;
        local_5c = 1;
        *(int *)&in_stack_fffffffffffff408->field_0x4 =
             *(int *)((long)&(local_80->m_pstack).c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_map + 4) *
             *(int *)&in_stack_fffffffffffff408->field_0x4;
        local_68 = local_80;
        local_6c = 2;
        *(int *)&in_stack_fffffffffffff408->_M_string_length =
             (int)(local_80->m_pstack).c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size *
             (int)in_stack_fffffffffffff408->_M_string_length;
        local_38 = (int *)((long)&in_stack_fffffffffffff408->_M_string_length + 4);
        local_40 = &local_204;
        local_c = 0;
        local_8 = local_40;
        *local_38 = local_204.vect[0] + *local_38;
        local_18 = local_40;
        local_1c = 1;
        *(int *)&in_stack_fffffffffffff408->field_2 =
             local_40->vect[1] + *(int *)&in_stack_fffffffffffff408->field_2;
        local_28 = local_40;
        local_2c = 2;
        *(int *)((long)&in_stack_fffffffffffff408->field_2 + 4) =
             local_40->vect[2] + *(int *)((long)&in_stack_fffffffffffff408->field_2 + 4);
        local_b8 = (int *)((long)&in_stack_fffffffffffff408->_M_string_length + 4);
        local_c0 = local_1f8;
        local_88 = local_1f8;
        local_8c = 0;
        *local_b8 = *(int *)&(local_1f8->m_pstack).c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_map * *local_b8;
        local_98 = local_c0;
        local_9c = 1;
        *(int *)&in_stack_fffffffffffff408->field_2 =
             *(int *)((long)&(local_c0->m_pstack).c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_map + 4) *
             *(int *)&in_stack_fffffffffffff408->field_2;
        local_a8 = local_c0;
        local_ac = 2;
        *(int *)((long)&in_stack_fffffffffffff408->field_2 + 4) =
             (int)(local_c0->m_pstack).c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size *
             *(int *)((long)&in_stack_fffffffffffff408->field_2 + 4);
        local_1e0 = (int *)((long)&in_stack_fffffffffffff408->_M_string_length + 4);
        local_1e8 = &local_204;
        local_184 = 0;
        local_180 = local_1e8;
        *local_1e0 = *local_1e0 - local_204.vect[0];
        local_190 = local_1e8;
        local_194 = 1;
        *(int *)&in_stack_fffffffffffff408->field_2 =
             *(int *)&in_stack_fffffffffffff408->field_2 - local_1e8->vect[1];
        local_1a0 = local_1e8;
        local_1a4 = 2;
        *(int *)((long)&in_stack_fffffffffffff408->field_2 + 4) =
             *(int *)((long)&in_stack_fffffffffffff408->field_2 + 4) - local_1e8->vect[2];
        in_stack_fffffffffffff408 = psVar12;
      }
    }
  }
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d38d7);
  ParmParse::queryAdd<bool,_0>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (bool *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
  IntVect::IntVect(&local_a14,*(byte *)(in_RDI + 0x81) & 1);
  local_3b0 = in_RDI + 0x84;
  *(int *)(in_RDI + 0x8c) = local_a14.vect[2];
  *(undefined8 *)(in_RDI + 0x84) = local_a14.vect._0_8_;
  local_3b4 = 0;
  ParmParse::queryAdd<int,_0>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (int *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
  local_3c0 = in_RDI + 0x84;
  local_3c4 = 1;
  ParmParse::queryAdd<int,_0>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (int *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
  local_3d0 = in_RDI + 0x84;
  local_3d4 = 2;
  ParmParse::queryAdd<int,_0>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (int *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
  local_1b0 = (int *)(in_RDI + 0x84);
  local_1b4 = 0;
  bVar11 = true;
  if ((*local_1b0 == 0) && (bVar11 = true, *(int *)(in_RDI + 0x88) == 0)) {
    bVar11 = *(int *)(in_RDI + 0x8c) != 0;
  }
  *(bool *)(in_RDI + 0x81) = bVar11;
  ParmParse::queryAdd<bool,_0>
            (in_stack_fffffffffffff410,(char *)in_stack_fffffffffffff408,
             (bool *)CONCAT17(bVar11,in_stack_fffffffffffff400));
  *(undefined4 *)(in_RDI + 0x94) = 0xffffffff;
  if ((*(byte *)(in_RDI + 0x90) & 1) != 0) {
    checkInput(in_stack_000000f0);
  }
  ParmParse::~ParmParse((ParmParse *)0x10d3af0);
  return;
}

Assistant:

void
AmrMesh::InitAmrMesh (int max_level_in, const Vector<int>& n_cell_in,
                      Vector<IntVect> a_refrat, const RealBox* rb,
                      int coord, const int* is_per)
{
    ParmParse pp("amr");

    pp.queryAdd("v",verbose);

    if (max_level_in == -1) {
       pp.get("max_level", max_level);
    } else {
       max_level = max_level_in;
    }

    int nlev = max_level + 1;

    blocking_factor.resize(nlev);
    max_grid_size.resize(nlev);
    n_error_buf.resize(nlev);

    geom.resize(nlev);
    dmap.resize(nlev);
    grids.resize(nlev);

    for (int i = 0; i < nlev; ++i) {
        n_error_buf[i]     = IntVect{AMREX_D_DECL(1,1,1)};
        blocking_factor[i] = IntVect{AMREX_D_DECL(8,8,8)};
        max_grid_size[i]   = (AMREX_SPACEDIM == 2) ? IntVect{AMREX_D_DECL(128,128,128)}
                                                   : IntVect{AMREX_D_DECL(32,32,32)};
    }

    // Make the default ref_ratio = 2 for all levels.
    ref_ratio.resize(max_level);
    for (int i = 0; i < max_level; ++i)
    {
      ref_ratio[i] = 2 * IntVect::TheUnitVector();
    }

    pp.queryAdd("n_proper",n_proper);
    pp.queryAdd("grid_eff",grid_eff);
    int cnt = pp.countval("n_error_buf");
    if (cnt > 0) {
        Vector<int> neb;
        pp.getarr("n_error_buf",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i] = IntVect(neb[i]);
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i] = IntVect(neb[cnt-1]);
        }
    }

    cnt = pp.countval("n_error_buf_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> neb;
        pp.getarr("n_error_buf_x",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("n_error_buf_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> neb;
        pp.getarr("n_error_buf_y",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("n_error_buf_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> neb;
        pp.getarr("n_error_buf_z",neb);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            n_error_buf[i][idim] = neb[i];
        }
        for (int i = n; i <= max_level; ++i) {
            n_error_buf[i][idim] = neb[n-1];
        }
    }
#endif

    // Read in the refinement ratio IntVects as integer AMREX_SPACEDIM-tuples.
    if (max_level > 0)
    {
        const int nratios_vect = max_level*AMREX_SPACEDIM;

        Vector<int> ratios_vect(nratios_vect);

        int got_vect = pp.queryarr("ref_ratio_vect",ratios_vect,0,nratios_vect);

        Vector<int> ratios;

        const int got_int = pp.queryarr("ref_ratio",ratios);

        if (got_int == 1 && got_vect == 1)
        {
            amrex::Abort("Only input *either* ref_ratio or ref_ratio_vect");
        }
        else if (got_vect == 1)
        {
            int k = 0;
            for (int i = 0; i < max_level; i++)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++,k++)
                    ref_ratio[i][n] = ratios_vect[k];
            }
        }
        else if (got_int == 1)
        {
            const int ncnt = ratios.size();
            for (int i = 0; i < ncnt && i < max_level; ++i)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++) {
                    ref_ratio[i][n] = ratios[i];
                }
            }
            for (int i = ncnt; i < max_level; ++i)
            {
                for (int n = 0; n < AMREX_SPACEDIM; n++) {
                    ref_ratio[i][n] = ratios.back();
                }
            }
        }
        else
        {
            if (verbose) {
                amrex::Print() << "Using default ref_ratio = 2 at all levels\n";
            }
        }
    }
    //if sent in, this wins over everything.
    if(a_refrat.size() > 0)
    {
      for (int i = 0; i < max_level; i++)
      {
          ref_ratio[i] = a_refrat[i];
      }
    }

    // Read in max_grid_size.  Use defaults if not explicitly defined.
    cnt = pp.countval("max_grid_size");
    if (cnt > 0) {
        Vector<int> mgs;
        pp.getarr("max_grid_size",mgs);
        int last_mgs = mgs.back();
        mgs.resize(max_level+1,last_mgs);
        SetMaxGridSize(mgs);
    }

    cnt = pp.countval("max_grid_size_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> mgs;
        pp.getarr("max_grid_size_x",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("max_grid_size_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> mgs;
        pp.getarr("max_grid_size_y",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("max_grid_size_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> mgs;
        pp.getarr("max_grid_size_z",mgs);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            max_grid_size[i][idim] = mgs[i];
        }
        for (int i = n; i <= max_level; ++i) {
            max_grid_size[i][idim] = mgs[n-1];
        }
    }
#endif

    // Read in the blocking_factors.  Use defaults if not explicitly defined.
    cnt = pp.countval("blocking_factor");
    if (cnt > 0) {
        Vector<int> bf;
        pp.getarr("blocking_factor",bf);
        int last_bf = bf.back();
        bf.resize(max_level+1,last_bf);
        SetBlockingFactor(bf);
    }

    cnt = pp.countval("blocking_factor_x");
    if (cnt > 0) {
        int idim = 0;
        Vector<int> bf;
        pp.getarr("blocking_factor_x",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }

#if (AMREX_SPACEDIM > 1)
    cnt = pp.countval("blocking_factor_y");
    if (cnt > 0) {
        int idim = 1;
        Vector<int> bf;
        pp.getarr("blocking_factor_y",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    cnt = pp.countval("blocking_factor_z");
    if (cnt > 0) {
        int idim = 2;
        Vector<int> bf;
        pp.getarr("blocking_factor_z",bf);
        int n = std::min(cnt, max_level+1);
        for (int i = 0; i < n; ++i) {
            blocking_factor[i][idim] = bf[i];
        }
        for (int i = n; i <= max_level; ++i) {
            blocking_factor[i][idim] = bf[n-1];
        }
    }
#endif

    // Read computational domain and set geometry.
    {
        Vector<int> n_cell(AMREX_SPACEDIM);
        if (n_cell_in[0] == -1)
        {
            pp.getarr("n_cell",n_cell,0,AMREX_SPACEDIM);
        }
        else
        {
            for (int i = 0; i < AMREX_SPACEDIM; i++) n_cell[i] = n_cell_in[i];
        }

        IntVect lo(IntVect::TheZeroVector()), hi(n_cell);
        hi -= IntVect::TheUnitVector();
        Box index_domain(lo,hi);
        for (int i = 0; i <= max_level; i++)
        {
            geom[i].define(index_domain, rb, coord, is_per);
            if (i < max_level) {
                index_domain.refine(ref_ratio[i]);
            }
        }
    }

    //chop up grids to have the number of grids be no less the number of procs
    {
        pp.queryAdd("refine_grid_layout", refine_grid_layout);

        refine_grid_layout_dims = IntVect(refine_grid_layout);
        AMREX_D_TERM(pp.queryAdd("refine_grid_layout_x", refine_grid_layout_dims[0]);,
                     pp.queryAdd("refine_grid_layout_y", refine_grid_layout_dims[1]);,
                     pp.queryAdd("refine_grid_layout_z", refine_grid_layout_dims[2]));

        refine_grid_layout = refine_grid_layout_dims != 0;
    }

    pp.queryAdd("check_input", check_input);

    finest_level = -1;

    if (check_input) checkInput();
}